

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  size_type sVar2;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  ulong extraout_RAX;
  uint uVar6;
  int iVar7;
  string *s_00;
  pair<const_char_*,_int> pVar8;
  string *local_60;
  key_arg<std::__cxx11::basic_string<char>_> *local_58;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  local_50;
  
  local_60 = (string *)ptr;
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
  if ((bVar4) || (*(char *)&(local_60->_M_dataplus)._M_p != '\n')) {
    if (local_60 == (string *)0x0) {
      return (char *)0x0;
    }
    MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>>
    ::_InternalParse(this);
    goto LAB_002500d7;
  }
  bVar1 = *(byte *)((long)&(local_60->_M_dataplus)._M_p + 1);
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar8 = ReadSizeFallback((char *)((long)&(local_60->_M_dataplus)._M_p + 1),(uint)bVar1);
    uVar6 = pVar8.second;
    pcVar5 = pVar8.first;
  }
  else {
    pcVar5 = (char *)((long)&(local_60->_M_dataplus)._M_p + 2);
  }
  s = &this->key_;
  if (pcVar5 == (char *)0x0) {
    local_60 = (string *)0x0;
  }
  else {
    local_60 = (string *)
               EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar5,uVar6,s);
  }
  if (local_60 == (string *)0x0) {
    return (char *)0x0;
  }
  bVar4 = WireFormatLite::VerifyUtf8String
                    ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                     "CoreML.Specification.Metadata.UserDefinedEntry.key");
  if (!bVar4) {
    return (char *)0x0;
  }
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
  if ((bVar4) || (*(char *)&(local_60->_M_dataplus)._M_p != '\x12')) {
    if (local_60 == (string *)0x0) {
      return (char *)0x0;
    }
LAB_002500c4:
    MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>
    ::
    Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>>
    ::_InternalParse(this);
  }
  else {
    sVar2 = (this->map_->elements_).num_elements_;
    Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::insert<std::__cxx11::string&>
              (&local_50,this->map_,s);
    s_00 = (string *)&(local_50.first.node_)->field_0x20;
    this->value_ptr_ = s_00;
    local_58 = s;
    if (sVar2 == (this->map_->elements_).num_elements_) {
      iVar7 = 0;
    }
    else {
      bVar1 = *(byte *)((long)&(local_60->_M_dataplus)._M_p + 1);
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar8 = ReadSizeFallback((char *)((long)&(local_60->_M_dataplus)._M_p + 1),(uint)bVar1);
        uVar6 = pVar8.second;
        pcVar5 = pVar8.first;
      }
      else {
        pcVar5 = (char *)((long)&(local_60->_M_dataplus)._M_p + 2);
      }
      if (pcVar5 == (char *)0x0) {
        local_60 = (string *)0x0;
      }
      else {
        local_60 = (string *)
                   EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar5,uVar6,s_00);
      }
      iVar3 = 1;
      if ((local_60 == (string *)0x0) ||
         (bVar4 = WireFormatLite::VerifyUtf8String
                            ((this->value_ptr_->_M_dataplus)._M_p,
                             (int)this->value_ptr_->_M_string_length,PARSE,
                             "CoreML.Specification.Metadata.UserDefinedEntry.value"), !bVar4)) {
LAB_00250144:
        iVar7 = iVar3;
        Map<std::__cxx11::string,std::__cxx11::string>::erase<std::__cxx11::string>
                  ((Map<std::__cxx11::string,std::__cxx11::string> *)this->map_,local_58);
        s_00 = (string *)0x0;
      }
      else {
        bVar4 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
        iVar7 = 1;
        s_00 = local_60;
        if (!bVar4) {
          MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>
          ::
          Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>>
          ::_InternalParse();
          iVar3 = 2;
          if ((extraout_RAX & 1) == 0) goto LAB_00250144;
          s_00 = (string *)0x0;
        }
      }
    }
    if (iVar7 == 1) {
      return (char *)s_00;
    }
    if (iVar7 == 0) goto LAB_002500c4;
  }
  MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,google::protobuf::MessageLite,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>
  ::
  Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,std::__cxx11::string,std::__cxx11::string,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)9>,google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>>
  ::_InternalParse();
LAB_002500d7:
  local_60 = (string *)
             MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
             ::_InternalParse(this->entry_,(char *)local_60,ctx);
  if (local_60 != (string *)0x0) {
    UseKeyAndValueFromEntry(this);
  }
  return (char *)local_60;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }